

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene_bsp.cpp
# Opt level: O2

void __thiscall
QGraphicsSceneBspTree::initialize(QGraphicsSceneBspTree *this,QRectF *rect,int depth)

{
  qreal qVar1;
  qreal qVar2;
  qreal qVar3;
  long in_FS_OFFSET;
  anon_union_8_2_82aba17e_for_Node_0 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  qVar1 = rect->xp;
  qVar2 = rect->yp;
  qVar3 = rect->h;
  (this->rect).w = rect->w;
  (this->rect).h = qVar3;
  (this->rect).xp = qVar1;
  (this->rect).yp = qVar2;
  this->leafCnt = 0;
  QList<QGraphicsSceneBspTree::Node>::resize
            (&this->nodes,(ulong)(uint)~(-1 << ((byte)depth + 1 & 0x1f)));
  local_58.offset = 0.0;
  uStack_50 = 0;
  QList<QGraphicsSceneBspTree::Node>::fill(&this->nodes,(parameter_type)&local_58,-1);
  QList<QList<QGraphicsItem_*>_>::resize(&this->leaves,1L << ((byte)depth & 0x3f));
  local_58.offset = 0.0;
  uStack_50 = 0;
  local_48 = 0;
  QList<QList<QGraphicsItem_*>_>::fill(&this->leaves,(parameter_type)&local_58,-1);
  QArrayDataPointer<QGraphicsItem_*>::~QArrayDataPointer
            ((QArrayDataPointer<QGraphicsItem_*> *)&local_58);
  initialize(this,rect,depth,0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsSceneBspTree::initialize(const QRectF &rect, int depth)
{
    this->rect = rect;
    leafCnt = 0;
    nodes.resize((1 << (depth + 1)) - 1);
    nodes.fill(Node());
    leaves.resize(1ll << depth);
    leaves.fill(QList<QGraphicsItem *>());

    initialize(rect, depth, 0);
}